

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001b28b0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001b28b7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001b28a0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001b28a8 = 0x2d2d2d2d2d2d2d;
    DAT_001b28af = 0x2d;
    _DAT_001b2890 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001b2898 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001b2880 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001b2888 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001b2878 = 0x2d2d2d2d2d2d2d2d;
    DAT_001b28bf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }